

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int send_msg(http_reply *http,int do_post,char *scep_operation,int operation,char *M_char,
            char *payload,size_t payload_len,int p_flag,char *host_name,int host_port,char *dir_name
            )

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *encoded;
  uint local_4060;
  int waited_sec;
  int fail_count;
  int ret;
  ulong uStack_4050;
  char port_str [6];
  size_t rlen;
  char http_string [16384];
  char *payload_local;
  char *M_char_local;
  int operation_local;
  char *scep_operation_local;
  int do_post_local;
  http_reply *http_local;
  
  pcVar2 = "GET";
  if (do_post != 0) {
    pcVar2 = "POST";
  }
  pcVar3 = "/";
  if (p_flag != 0) {
    pcVar3 = "";
  }
  iVar1 = snprintf((char *)&rlen,0x4000,"%s %s%s?operation=%s",pcVar2,pcVar3,dir_name,scep_operation
                  );
  uStack_4050 = (ulong)iVar1;
  exit_string_overflow((uint)(0x3fff < uStack_4050));
  if ((do_post == 0) && (payload_len != 0)) {
    pcVar2 = url_encode(payload,payload_len);
    iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,"&message=%s",pcVar2);
    uStack_4050 = (long)iVar1 + uStack_4050;
    free(pcVar2);
    exit_string_overflow((uint)(0x3fff < uStack_4050));
  }
  if (M_char != (char *)0x0) {
    iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,"&%s",M_char);
    uStack_4050 = (long)iVar1 + uStack_4050;
    exit_string_overflow((uint)(0x3fff < uStack_4050));
  }
  if (host_port == 0x50) {
    iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,
                     " HTTP/1.1\r\nHost: %s\r\nConnection: close\r\n",host_name);
    uStack_4050 = (long)iVar1 + uStack_4050;
  }
  else {
    iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,
                     " HTTP/1.1\r\nHost: %s:%d\r\nConnection: close\r\n",host_name,
                     (ulong)(uint)host_port);
    uStack_4050 = (long)iVar1 + uStack_4050;
  }
  exit_string_overflow((uint)(0x3fff < uStack_4050));
  if (do_post != 0) {
    iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,"Content-Length: %zu\r\n",
                     payload_len);
    uStack_4050 = (long)iVar1 + uStack_4050;
    exit_string_overflow((uint)(0x3fff < uStack_4050));
  }
  iVar1 = snprintf(http_string + (uStack_4050 - 8),0x4000 - uStack_4050,"\r\n");
  uStack_4050 = (long)iVar1 + uStack_4050;
  exit_string_overflow((uint)(0x3fff < uStack_4050));
  if (do_post != 0) {
    memcpy(http_string + (uStack_4050 - 8),payload,payload_len);
    uStack_4050 = payload_len + uStack_4050;
    exit_string_overflow((uint)(0x3fff < uStack_4050));
  }
  if (d_flag != 0) {
    fprintf(_stdout,"%s: scep request:\n%s",pname,&rlen);
  }
  sprintf((char *)((long)&fail_count + 2),"%d",(ulong)(uint)host_port);
  local_4060 = 0;
  encoded._4_4_ = 0;
  while (iVar1 = http_request(http,host_name,(char *)((long)&fail_count + 2),(char *)&rlen,
                              uStack_4050), iVar1 != 0) {
    if ((iVar1 == 2) || (W_flag <= encoded._4_4_)) {
      return 1;
    }
    local_4060 = local_4060 + 1;
    if (W_flag < (int)(encoded._4_4_ + local_4060)) {
      sleep(W_flag - encoded._4_4_);
      encoded._4_4_ = W_flag;
    }
    else {
      sleep(local_4060);
      encoded._4_4_ = local_4060 + encoded._4_4_;
    }
  }
  if (operation == 1) {
    if ((http->mime_type == (char *)0x0) ||
       (iVar1 = strcmp(http->mime_type,"application/x-x509-ca-cert"), iVar1 != 0)) {
      if ((http->mime_type == (char *)0x0) ||
         ((iVar1 = strcmp(http->mime_type,"application/x-x509-ca-ra-cert"), iVar1 != 0 &&
          (iVar1 = strcmp(http->mime_type,"application/x-x509-ra-ca-certs"), iVar1 != 0))))
      goto LAB_0010b0cf;
      http->type = 3;
    }
    else {
      http->type = 1;
    }
  }
  else if (operation == 0xf) {
    if ((http->mime_type == (char *)0x0) ||
       (iVar1 = strcmp(http->mime_type,"application/x-x509-next-ca-cert"), iVar1 != 0)) {
LAB_0010b0cf:
      if (v_flag != 0) {
        fprintf(_stderr,"%s: wrong (or missing) MIME content type\n",pname);
      }
      return 1;
    }
    http->type = 7;
  }
  else if (operation == 0x1f) {
    http->type = 0xf;
  }
  else {
    if ((http->mime_type == (char *)0x0) ||
       (iVar1 = strcmp(http->mime_type,"application/x-pki-message"), iVar1 != 0)) goto LAB_0010b0cf;
    http->type = 5;
  }
  return 0;
}

Assistant:

int
send_msg(struct http_reply *http, int do_post, char *scep_operation,
		int operation, char *M_char, char *payload, size_t payload_len,
		int p_flag, char *host_name, int host_port, char *dir_name)
{
	char			http_string[16384];
	size_t			rlen;
	char			port_str[6]; /* Range-checked to be max. 5-digit number */
	int ret, fail_count, waited_sec;

	rlen = snprintf(http_string, sizeof(http_string),
		"%s %s%s?operation=%s",
		do_post ? "POST" : "GET", p_flag ? "" : "/", dir_name, scep_operation);
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (!do_post && payload_len > 0) {
		char *encoded = url_encode((char *)payload, payload_len);
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"&message=%s", encoded);
		free(encoded);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (M_char != NULL) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"&%s", M_char);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (host_port == 80) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
						" HTTP/1.1\r\n"
						"Host: %s\r\n"
						"Connection: close\r\n", host_name);
	} else {
		/* According to RFC2616, non-default port must be added. */
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				" HTTP/1.1\r\n"
				"Host: %s:%d\r\n"
				"Connection: close\r\n", host_name, host_port);
	}
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (do_post) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"Content-Length: %zu\r\n", payload_len);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
			"\r\n");
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (do_post) {
		/* concat post data */
		memcpy(http_string+rlen, payload, payload_len);

		rlen += payload_len;
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (d_flag){
		fprintf(stdout, "%s: scep request:\n%s", pname, http_string);
	}

	sprintf(port_str, "%d", host_port);

	fail_count = 0;
	waited_sec = 0;
	/* will retry with linear backoff, just like wget does */
	while (1) {
		ret = http_request(http, host_name, port_str, http_string, rlen);
		if (ret == 0)
			break;
		if (ret == 2 || waited_sec >= W_flag)
			return (1);

		++fail_count;
		if ((waited_sec + fail_count) <= W_flag) {
			sleep(fail_count);
			waited_sec += fail_count;
		} else {
			sleep(W_flag - waited_sec);
			waited_sec = W_flag;
		}
	}

	/* Set SCEP reply type */
	switch (operation) {
		case SCEP_OPERATION_GETCA:
			if (http->mime_type && !strcmp(http->mime_type, MIME_GETCA)) {
				http->type = SCEP_MIME_GETCA;
			} else if (http->mime_type && (!strcmp(http->mime_type, MIME_GETCA_RA) || !strcmp(http->mime_type, MIME_GETCA_RA_ENTRUST))) {
				http->type = SCEP_MIME_GETCA_RA;
			} else {
				goto mime_err;
			}
			break;
		case SCEP_OPERATION_GETNEXTCA:
			if (http->mime_type && !strcmp(http->mime_type, MIME_GETNEXTCA)) {
				http->type = SCEP_MIME_GETNEXTCA;
			} else {
				goto mime_err;
			}
			break;
		case SCEP_OPERATION_GETCAPS:
			/* RFC8894: Clients SHOULD ignore the Content-type, as older
                           implementations of SCEP may send various Content-types. */
			http->type = SCEP_MIME_GETCAPS;
			break;
		default:
			if (http->mime_type && !strcmp(http->mime_type, MIME_PKI)) {
				http->type = SCEP_MIME_PKI;
			} else {
				goto mime_err;
			}
			break;
	}

	return (0);

mime_err:
	if (v_flag)
		fprintf(stderr, "%s: wrong (or missing) MIME content type\n", pname);

	return (1);
}